

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_codec.c
# Opt level: O2

int frame_codec_encode_frame
              (FRAME_CODEC_HANDLE frame_codec,uint8_t type,PAYLOAD *payloads,size_t payload_count,
              uchar *type_specific_bytes,uint32_t type_specific_size,
              ON_BYTES_ENCODED on_bytes_encoded,void *callback_context)

{
  size_t __n;
  uint uVar1;
  LOGGER_LOG p_Var2;
  uchar *__ptr;
  int iVar3;
  size_t *psVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  size_t __size;
  byte bVar8;
  char *pcVar9;
  bool bVar10;
  uchar padding_bytes [3];
  
  if (on_bytes_encoded != (ON_BYTES_ENCODED)0x0 && frame_codec != (FRAME_CODEC_HANDLE)0x0) {
    if ((type_specific_size < 0x3f7) &&
       (type_specific_bytes != (uchar *)0x0 || type_specific_size == 0)) {
      if (payload_count == 0 || payloads != (PAYLOAD *)0x0) {
        uVar1 = type_specific_size + 9 & 0x3fc;
        bVar8 = ((char)uVar1 - (char)type_specific_size) - 6;
        psVar4 = &payloads->length;
        lVar7 = 0;
        sVar5 = payload_count;
        while (bVar10 = sVar5 != 0, sVar5 = sVar5 - 1, bVar10) {
          if ((((PAYLOAD *)(psVar4 + -1))->bytes == (uchar *)0x0) || (*psVar4 == 0)) {
            p_Var2 = xlogging_get_log_function();
            iVar6 = 0x279;
            if (p_Var2 == (LOGGER_LOG)0x0) {
              return 0x279;
            }
            pcVar9 = "Bad payload entry";
            iVar3 = 0x278;
            goto LAB_00111887;
          }
          lVar7 = lVar7 + *psVar4;
          psVar4 = psVar4 + 2;
        }
        __size = lVar7 + (ulong)uVar1;
        if (frame_codec->max_frame_size < __size) {
          p_Var2 = xlogging_get_log_function();
          iVar6 = 0x284;
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return 0x284;
          }
          pcVar9 = "Encoded frame size exceeds the maximum allowed frame size";
          iVar3 = 0x283;
        }
        else {
          __ptr = (uchar *)malloc(__size);
          if (__ptr != (uchar *)0x0) {
            padding_bytes[0] = '\0';
            padding_bytes[1] = '\0';
            padding_bytes[2] = '\0';
            *__ptr = (uchar)(__size >> 0x18);
            __ptr[1] = (uchar)(__size >> 0x10);
            __ptr[2] = (uchar)(__size >> 8);
            __ptr[3] = (uchar)__size;
            __ptr[4] = (uchar)(type_specific_size + 9 >> 2);
            __ptr[5] = type;
            if (type_specific_size == 0) {
              lVar7 = 6;
            }
            else {
              memcpy(__ptr + 6,type_specific_bytes,(ulong)type_specific_size);
              lVar7 = (ulong)type_specific_size + 6;
            }
            if (bVar8 != 0) {
              memcpy(__ptr + lVar7,padding_bytes,(ulong)bVar8);
              lVar7 = lVar7 + (ulong)bVar8;
            }
            psVar4 = &payloads->length;
            while (bVar10 = payload_count != 0, payload_count = payload_count - 1, bVar10) {
              __n = *psVar4;
              memcpy(__ptr + lVar7,((PAYLOAD *)(psVar4 + -1))->bytes,__n);
              lVar7 = lVar7 + __n;
              psVar4 = psVar4 + 2;
            }
            (*on_bytes_encoded)(callback_context,__ptr,__size,true);
            free(__ptr);
            return 0;
          }
          p_Var2 = xlogging_get_log_function();
          iVar6 = 0x28e;
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return 0x28e;
          }
          pcVar9 = "Cannot allocate memory for frame";
          iVar3 = 0x28d;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        iVar6 = 0x259;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0x259;
        }
        pcVar9 = "NULL payloads argument with non-zero payload count";
        iVar3 = 600;
      }
LAB_00111887:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/frame_codec.c"
                ,"frame_codec_encode_frame",iVar3,1,pcVar9);
      return iVar6;
    }
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/frame_codec.c"
              ,"frame_codec_encode_frame",0x252,1,
              "Bad arguments: frame_codec = %p, on_bytes_encoded = %p, type_specific_size = %u, type_specific_bytes = %p"
              ,frame_codec,on_bytes_encoded,(ulong)type_specific_size,type_specific_bytes);
  }
  return 0x253;
}

Assistant:

int frame_codec_encode_frame(FRAME_CODEC_HANDLE frame_codec, uint8_t type, const PAYLOAD* payloads, size_t payload_count, const unsigned char* type_specific_bytes, uint32_t type_specific_size, ON_BYTES_ENCODED on_bytes_encoded, void* callback_context)
{
    int result;

    FRAME_CODEC_INSTANCE* frame_codec_data = (FRAME_CODEC_INSTANCE*)frame_codec;

    /* Codes_SRS_FRAME_CODEC_01_044: [If any of arguments `frame_codec` or `on_bytes_encoded` is NULL, `frame_codec_encode_frame` shall return a non-zero value.] */
    if ((frame_codec == NULL) ||
        (on_bytes_encoded == NULL) ||
        /* Codes_SRS_FRAME_CODEC_01_091: [If the argument type_specific_size is greater than 0 and type_specific_bytes is NULL, frame_codec_encode_frame shall return a non-zero value.] */
        ((type_specific_size > 0) && (type_specific_bytes == NULL)) ||
        /* Codes_SRS_FRAME_CODEC_01_092: [If type_specific_size is too big to allow encoding the frame according to the AMQP ISO then frame_codec_encode_frame shall return a non-zero value.] */
        (type_specific_size > MAX_TYPE_SPECIFIC_SIZE))
    {
        LogError("Bad arguments: frame_codec = %p, on_bytes_encoded = %p, type_specific_size = %u, type_specific_bytes = %p",
            frame_codec, on_bytes_encoded, (unsigned int)type_specific_size, type_specific_bytes);
        result = MU_FAILURE;
    }
    else if ((payloads == NULL) && (payload_count > 0))
    {
        /* Codes_SRS_FRAME_CODEC_01_107: [If the argument `payloads` is NULL and `payload_count` is non-zero, `frame_codec_encode_frame` shall return a non-zero value.]*/
        LogError("NULL payloads argument with non-zero payload count");
        result = MU_FAILURE;
    }
    else
    {
        /* round up to the 4 bytes for doff */
        /* Codes_SRS_FRAME_CODEC_01_067: [The value of the data offset is an unsigned, 8-bit integer specifying a count of 4-byte words.] */
        /* Codes_SRS_FRAME_CODEC_01_068: [Due to the mandatory 8-byte frame header, the frame is malformed if the value is less than 2.] */
        uint8_t padding_byte_count;
        uint32_t frame_body_offset = type_specific_size + 6;
        uint8_t doff = (uint8_t)((frame_body_offset + 3) / 4);
        size_t i;
        size_t frame_size;
        size_t frame_body_size = 0;
        frame_body_offset = doff * 4;
        padding_byte_count = (uint8_t)(frame_body_offset - type_specific_size - 6);

        for (i = 0; i < payload_count; i++)
        {
            /* Codes_SRS_FRAME_CODEC_01_110: [ If the `bytes` member of a payload entry is NULL, `frame_codec_encode_frame` shall fail and return a non-zero value. ] */
            if ((payloads[i].bytes == NULL) ||
                /* Codes_SRS_FRAME_CODEC_01_111: [ If the `length` member of a payload entry is 0, `frame_codec_encode_frame` shall fail and return a non-zero value. ] */
                (payloads[i].length == 0))
            {
                break;
            }

            frame_body_size += payloads[i].length;
        }

        if (i < payload_count)
        {
            LogError("Bad payload entry");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_FRAME_CODEC_01_063: [This is an unsigned 32-bit integer that MUST contain the total frame size of the frame header, extended header, and frame body.] */
            frame_size = frame_body_size + frame_body_offset;

            if (frame_size > frame_codec_data->max_frame_size)
            {
                /* Codes_SRS_FRAME_CODEC_01_095: [If the frame_size needed for the frame is bigger than the maximum frame size, frame_codec_encode_frame shall fail and return a non-zero value.] */
                LogError("Encoded frame size exceeds the maximum allowed frame size");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_FRAME_CODEC_01_108: [ Memory shall be allocated to hold the entire frame. ]*/
                unsigned char* encoded_frame = (unsigned char*)malloc(frame_size);
                if (encoded_frame == NULL)
                {
                    /* Codes_SRS_FRAME_CODEC_01_109: [ If allocating memory fails, `frame_codec_encode_frame` shall fail and return a non-zero value. ]*/
                    LogError("Cannot allocate memory for frame");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_FRAME_CODEC_01_042: [frame_codec_encode_frame encodes the header, type specific bytes and frame payload of a frame that has frame_payload_size bytes.]*/
                    /* Codes_SRS_FRAME_CODEC_01_055: [Frames are divided into three distinct areas: a fixed width frame header, a variable width extended header, and a variable width frame body.] */
                    /* Codes_SRS_FRAME_CODEC_01_056: [frame header The frame header is a fixed size (8 byte) structure that precedes each frame.] */
                    /* Codes_SRS_FRAME_CODEC_01_057: [The frame header includes mandatory information necessary to parse the rest of the frame including size and type information.] */
                    /* Codes_SRS_FRAME_CODEC_01_058: [extended header The extended header is a variable width area preceding the frame body.] */
                    /* Codes_SRS_FRAME_CODEC_01_059: [This is an extension point defined for future expansion.] */
                    /* Codes_SRS_FRAME_CODEC_01_060: [The treatment of this area depends on the frame type.]*/
                    /* Codes_SRS_FRAME_CODEC_01_062: [SIZE Bytes 0-3 of the frame header contain the frame size.] */
                    /* Codes_SRS_FRAME_CODEC_01_063: [This is an unsigned 32-bit integer that MUST contain the total frame size of the frame header, extended header, and frame body.] */
                    /* Codes_SRS_FRAME_CODEC_01_064: [The frame is malformed if the size is less than the size of the frame header (8 bytes).] */
                    unsigned char frame_header[6];
                    size_t current_pos = 0;
                    /* Codes_SRS_FRAME_CODEC_01_090: [If the type_specific_size - 2 does not divide by 4, frame_codec_encode_frame shall pad the type_specific bytes with zeroes so that type specific data is according to the AMQP ISO.] */
                    unsigned char padding_bytes[] = { 0x00, 0x00, 0x00 };

                    frame_header[0] = (frame_size >> 24) & 0xFF;
                    frame_header[1] = (frame_size >> 16) & 0xFF;
                    frame_header[2] = (frame_size >> 8) & 0xFF;
                    frame_header[3] = frame_size & 0xFF;
                    /* Codes_SRS_FRAME_CODEC_01_065: [DOFF Byte 4 of the frame header is the data offset.] */
                    frame_header[4] = doff;
                    /* Codes_SRS_FRAME_CODEC_01_069: [TYPE Byte 5 of the frame header is a type code.] */
                    frame_header[5] = type;

                    (void)memcpy(encoded_frame, frame_header, sizeof(frame_header));
                    current_pos += sizeof(frame_header);

                    if (type_specific_size > 0)
                    {
                        (void)memcpy(encoded_frame + current_pos, type_specific_bytes, type_specific_size);
                        current_pos += type_specific_size;
                    }

                    /* send padding bytes */
                    if (padding_byte_count > 0)
                    {
                        (void)memcpy(encoded_frame + current_pos, padding_bytes, padding_byte_count);
                        current_pos += padding_byte_count;
                    }

                    /* Codes_SRS_FRAME_CODEC_01_106: [All payloads shall be encoded in order as part of the frame.] */
                    for (i = 0; i < payload_count; i++)
                    {
                        (void)memcpy(encoded_frame + current_pos, payloads[i].bytes, payloads[i].length);
                        current_pos += payloads[i].length;
                    }

                    /* Codes_SRS_FRAME_CODEC_01_088: [Encoded bytes shall be passed to the `on_bytes_encoded` callback in a single call, while setting the `encode complete` argument to true.] */
                    on_bytes_encoded(callback_context, encoded_frame, frame_size, true);

                    free(encoded_frame);

                    /* Codes_SRS_FRAME_CODEC_01_043: [On success it shall return 0.] */
                    result = 0;
                }
            }
        }
    }

    return result;
}